

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<char[5],std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,char (*lhs) [5],char *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<char[5]>(&local_48,(char (*) [5])this);
  String::String(&local_60,*lhs);
  operator+(&local_30,&local_48,&local_60);
  toStream<std::__cxx11::string>(&SStack_78,(detail *)op,in);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }